

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[7],char_const*,char[15],char_const*,char[2],unsigned_int,char[10],char_const*,char[79]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [7],char **RestArgs,char (*RestArgs_1) [15],char **RestArgs_2,
               char (*RestArgs_3) [2],uint *RestArgs_4,char (*RestArgs_5) [10],char **RestArgs_6,
               char (*RestArgs_7) [79])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[15],char_const*,char[2],unsigned_int,char[10],char_const*,char[79]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}